

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeRegularExpressionCommand.h
# Opt level: O0

cmCommand * __thiscall
cmIncludeRegularExpressionCommand::Clone(cmIncludeRegularExpressionCommand *this)

{
  cmCommand *this_00;
  cmIncludeRegularExpressionCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmIncludeRegularExpressionCommand((cmIncludeRegularExpressionCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmIncludeRegularExpressionCommand; }